

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

bool_t rngTestFIPS2(octet *buf)

{
  byte bVar1;
  long lVar2;
  int local_48 [16];
  
  memSet(local_48,'\0',0x40);
  lVar2 = 0x9c4;
  do {
    bVar1 = buf[lVar2 + -1];
    local_48[bVar1 & 0xf] = local_48[bVar1 & 0xf] + 1;
    local_48[bVar1 >> 4] = local_48[bVar1 >> 4] + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  local_48[0] = local_48[0] * local_48[0];
  lVar2 = 1;
  do {
    local_48[0] = local_48[0] + local_48[lVar2] * local_48[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return (bool_t)(local_48[0] * 0x10 + 0xfe825d8fU < 0x35b91);
}

Assistant:

bool_t rngTestFIPS2(const octet buf[2500])
{
	u32 s[16];
	size_t i = 2500;
	ASSERT(memIsValid(buf, 2500));
	memSetZero(s, sizeof(s));
	while (i--)
		++s[buf[i] & 15], ++s[buf[i] >> 4];
	s[0] *= s[0];
	for (i = 1; i < 16; ++i)
		s[0] += s[i] * s[i];
	s[0] = 16 * s[0] - 5000 * 5000;
	return 10800 < s[0] && s[0] < 230850;
}